

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::clara::detail::Help::Help(Help *this,bool *showHelpFlag)

{
  Opt *pOVar1;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  anon_class_8_1_beab0a68_for_m_lambda local_20;
  bool *local_18;
  bool *showHelpFlag_local;
  Help *this_local;
  
  local_20.showHelpFlag = showHelpFlag;
  local_18 = showHelpFlag;
  showHelpFlag_local = (bool *)this;
  Opt::Opt<Catch::clara::detail::Help::Help(bool&)::_lambda(bool)_1_>(&this->super_Opt,&local_20);
  (this->super_Opt).super_ParserRefImpl<Catch::clara::detail::Opt>.
  super_ComposableParserImpl<Catch::clara::detail::Opt>.super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__Help_0027dba8;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"display usage information",&local_41);
  pOVar1 = ParserRefImpl<Catch::clara::detail::Opt>::operator()
                     ((ParserRefImpl<Catch::clara::detail::Opt> *)this,&local_40);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"-?",&local_79);
  pOVar1 = Opt::operator[](pOVar1,&local_78);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"-h",&local_a1);
  pOVar1 = Opt::operator[](pOVar1,&local_a0);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"--help",&local_c9);
  pOVar1 = Opt::operator[](pOVar1,&local_c8);
  ParserRefImpl<Catch::clara::detail::Opt>::optional
            (&pOVar1->super_ParserRefImpl<Catch::clara::detail::Opt>);
  ::std::__cxx11::string::~string((string *)&local_c8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

Help( bool &showHelpFlag )
        :   Opt([&]( bool flag ) {
                showHelpFlag = flag;
                return ParserResult::ok( ParseResultType::ShortCircuitAll );
            })
        {
            static_cast<Opt &>( *this )
                    ("display usage information")
                    ["-?"]["-h"]["--help"]
                    .optional();
        }